

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O3

Var Js::JavascriptArray::SliceHelper<unsigned_long>
              (JavascriptArray *pArr,TypedArrayBase *typedArrayBase,RecyclableObject *obj,
              unsigned_long length,Arguments *args,ScriptContext *scriptContext)

{
  Type TVar1;
  ThreadContext *this;
  code *pcVar2;
  uint32 start;
  anon_class_24_1_2f014396_conflict1 implicitCall;
  ScriptContext *scriptContext_00;
  bool bVar3;
  BOOL BVar4;
  int iVar5;
  JavascriptCopyOnAccessNativeIntArray *pJVar6;
  Var pvVar7;
  undefined4 *puVar8;
  RecyclableObject *this_00;
  undefined8 uVar9;
  TypedArrayBase *obj_00;
  JavascriptFunction *defaultConstructor;
  JavascriptFunction *instanceObj;
  JavascriptArray *obj_01;
  JavascriptArray *pJVar10;
  JavascriptNativeIntArray *dstArray;
  JavascriptNativeIntArray *srcArray;
  TypedArrayBase *pTVar11;
  undefined4 extraout_var;
  uint64 uVar12;
  uint64 uVar13;
  JavascriptNativeFloatArray *dstArray_00;
  JavascriptNativeFloatArray *srcArray_00;
  uint32 i;
  uint uVar14;
  uint uVar15;
  undefined1 auStack_a8 [8];
  Var element;
  ScriptContext *local_98;
  JavascriptArray *local_90;
  JavascriptArray *local_88;
  TypedArrayBase *local_80;
  ScriptContext *local_78;
  unsigned_long local_70;
  RecyclableObject *local_68;
  undefined1 local_60 [8];
  JsReentLock jsReentLock;
  bool local_33;
  bool local_32;
  bool local_31 [6];
  bool isBuiltinArrayCtor;
  bool isIntArray;
  bool isFloatArray;
  
  local_60 = (undefined1  [8])scriptContext->threadContext;
  jsReentLock.m_threadContext = (ThreadContext *)0x0;
  jsReentLock.m_arrayObject = (Var)0x0;
  jsReentLock.m_arrayObject2._0_1_ = ((ThreadContext *)local_60)->noJsReentrancy;
  ((ThreadContext *)local_60)->noJsReentrancy = true;
  local_80 = typedArrayBase;
  local_78 = scriptContext;
  local_68 = obj;
  jsReentLock._24_8_ = length;
  JsReentLock::setObjectForMutation((JsReentLock *)local_60,pArr);
  local_32 = false;
  local_70 = 0;
  local_31[0] = false;
  local_33 = true;
  if (((pArr != (JavascriptArray *)0x0) &&
      (bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pArr), bVar3)) &&
     (pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pArr),
     pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
    JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
  }
  if (((ulong)args->Info & 0xfffffe) != 0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    pvVar7 = Arguments::operator[](args,1);
    local_70 = GetFromIndex<unsigned_long>(pvVar7,jsReentLock._24_8_,local_78,true);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
    if (2 < (*(uint *)&args->Info & 0xffffff)) {
      pvVar7 = Arguments::operator[](args,2);
      if (pvVar7 == (Var)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
        if (!bVar3) goto LAB_00b90291;
        *puVar8 = 0;
LAB_00b8f4a5:
        this_00 = UnsafeVarTo<Js::RecyclableObject>(pvVar7);
        if (this_00 == (RecyclableObject *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                      ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
          if (!bVar3) goto LAB_00b90291;
          *puVar8 = 0;
        }
        TVar1 = ((this_00->type).ptr)->typeId;
        if ((int)TVar1 < 0x58) {
          if (TVar1 == TypeIds_Undefined) goto LAB_00b8f5c6;
        }
        else {
          BVar4 = RecyclableObject::IsExternal(this_00);
          if (BVar4 == 0) {
            AssertCount = AssertCount + 1;
            Throw::LogAssert();
            puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
            *puVar8 = 1;
            bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                        ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                        "GetTypeId aValue has invalid TypeId");
            goto LAB_00b8f570;
          }
        }
      }
      else if (((ulong)pvVar7 & 0x1ffff00000000) == 0x1000000000000 ||
               ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000) {
        if ((ulong)pvVar7 >> 0x32 == 0 && ((ulong)pvVar7 & 0xffff000000000000) != 0x1000000000000)
        goto LAB_00b8f4a5;
      }
      else {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/TaggedInt.inl"
                                    ,0x2a,"((uintptr_t)aValue >> 32 == (AtomTag << 16))",
                                    "(uintptr_t)aValue >> 32 == (AtomTag << 16)");
LAB_00b8f570:
        if (bVar3 == false) goto LAB_00b90291;
        *puVar8 = 0;
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      pvVar7 = Arguments::operator[](args,2);
      jsReentLock._24_8_ = GetFromIndex<unsigned_long>(pvVar7,jsReentLock._24_8_,local_78,true);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
    }
LAB_00b8f5c6:
    uVar9._0_1_ = false;
    uVar9._1_7_ = 0;
    bVar3 = (ulong)jsReentLock._24_8_ < local_70;
    jsReentLock._24_8_ = jsReentLock._24_8_ - local_70;
    if (bVar3) {
      jsReentLock._24_8_ = uVar9;
    }
  }
  if (pArr == (JavascriptArray *)0x0) {
LAB_00b8f64b:
    pArr = (JavascriptArray *)0x0;
  }
  else {
    bVar3 = IsNonES5Array(local_68);
    if (!bVar3) {
      bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_68);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x18f8,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar3) goto LAB_00b90291;
        *puVar8 = 0;
      }
      goto LAB_00b8f64b;
    }
  }
  BVar4 = TypedArrayBase::IsDetachedTypedArray(local_68);
  if (BVar4 != 0) {
    JavascriptError::ThrowTypeError(local_78,-0x7ff5ebe5,L"Array.prototype.slice");
  }
  if (local_80 == (TypedArrayBase *)0x0 && pArr == (JavascriptArray *)0x0) {
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>(local_68);
    if (bVar3) {
      obj_00 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>(local_68);
    }
    else {
LAB_00b8f807:
      obj_00 = (TypedArrayBase *)0x0;
    }
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    obj_01 = (JavascriptArray *)
             ArraySpeciesCreate<unsigned_long>
                       (local_68,jsReentLock._24_8_,local_78,(bool *)0x0,(bool *)0x0,&local_33);
    *(bool *)((long)local_60 + 0x108) = true;
    if (obj_01 != (JavascriptArray *)0x0) goto LAB_00b8f897;
LAB_00b8f8fc:
    if ((ulong)jsReentLock._24_8_ >> 0x20 != 0) {
      JavascriptError::ThrowRangeError(local_78,-0x7ff5ec5b,(PCWSTR)0x0);
    }
    pJVar10 = CreateNewArrayHelper(jsReentLock._24_4_,local_32,local_31[0],pArr,local_78);
    if (((pJVar10 != (JavascriptArray *)0x0) &&
        (bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10), bVar3)) &&
       (pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10),
       pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
      JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
    }
    JsReentLock::setSecondObjectForMutation((JsReentLock *)local_60,pJVar10);
    obj_01 = pJVar10;
    if (pJVar10 == (JavascriptArray *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x194f,"(newObj)","newObj");
      if (!bVar3) goto LAB_00b90291;
      *puVar8 = 0;
      pJVar10 = (JavascriptArray *)0x0;
      obj_01 = (JavascriptArray *)0x0;
    }
  }
  else {
    if (local_80 == (TypedArrayBase *)0x0) {
      if (pArr == (JavascriptArray *)0x0) goto LAB_00b8f807;
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      obj_01 = (JavascriptArray *)
               ArraySpeciesCreate<unsigned_long>
                         (pArr,jsReentLock._24_8_,local_78,&local_32,local_31,&local_33);
      *(bool *)((long)local_60 + 0x108) = true;
      if (obj_01 == (JavascriptArray *)0x0) {
        GetArrayTypeAndConvert(pArr,&local_32,local_31);
        obj_00 = (TypedArrayBase *)0x0;
        goto LAB_00b8f8fc;
      }
      obj_00 = (TypedArrayBase *)0x0;
    }
    else {
      pvVar7 = Arguments::operator[](args,0);
      scriptContext_00 = local_78;
      defaultConstructor = TypedArrayBase::GetDefaultConstructor(pvVar7,local_78);
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      instanceObj = (JavascriptFunction *)
                    JavascriptOperators::SpeciesConstructor
                              ((RecyclableObject *)local_80,defaultConstructor,scriptContext_00);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      local_33 = false;
      if (pArr != (JavascriptArray *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1910,"(pArr == nullptr)","pArr == nullptr");
        if (bVar3) {
          *puVar8 = 0;
          Throw::FatalInternalError(-0x7fffbffb);
        }
        goto LAB_00b90291;
      }
      bVar3 = JavascriptOperators::IsConstructor((RecyclableObject *)instanceObj);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x1911,"(JavascriptOperators::IsConstructor(constructor))",
                                    "JavascriptOperators::IsConstructor(constructor)");
        if (!bVar3) goto LAB_00b90291;
        *puVar8 = 0;
      }
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      this = local_78->threadContext;
      element = (Var)jsReentLock._24_8_;
      local_98 = local_78;
      auStack_a8 = (undefined1  [8])instanceObj;
      if (instanceObj == defaultConstructor) {
        bVar3 = this->reentrancySafeOrHandled;
        this->reentrancySafeOrHandled = true;
        pvVar7 = anon_func::anon_class_24_1_2f014396::
                 anon_class_24_3_6139f5b6_for_newObjectCreationFunction::operator()
                           ((anon_class_24_3_6139f5b6_for_newObjectCreationFunction *)auStack_a8);
        this->reentrancySafeOrHandled = bVar3;
      }
      else {
        implicitCall.newObjectCreationFunction.newLenT = jsReentLock._24_8_;
        implicitCall.newObjectCreationFunction.constructor = (RecyclableObject *)instanceObj;
        implicitCall.newObjectCreationFunction.scriptContext = local_78;
        pvVar7 = ThreadContext::
                 ExecuteImplicitCall<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_chakra_core[P]ChakraCore_lib_Runtime___Language_JavascriptOperators_inl:168:95)>
                           (this,(RecyclableObject *)instanceObj,ImplicitCall_Accessor,implicitCall)
        ;
      }
      obj_01 = (JavascriptArray *)VarTo<Js::RecyclableObject>(pvVar7);
      JsReentLock::MutateArrayObject((JsReentLock *)local_60);
      *(bool *)((long)local_60 + 0x108) = true;
      obj_00 = local_80;
      if (obj_01 == (JavascriptArray *)0x0) goto LAB_00b8f8fc;
    }
LAB_00b8f897:
    bVar3 = IsNonES5Array(obj_01);
    if ((bVar3) &&
       (pJVar10 = UnsafeVarTo<Js::JavascriptArray>(obj_01), pJVar10 != (JavascriptArray *)0x0)) {
      bVar3 = VarIs<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10);
      if ((bVar3) &&
         (pJVar6 = UnsafeVarTo<Js::JavascriptCopyOnAccessNativeIntArray>(pJVar10),
         pJVar6 != (JavascriptCopyOnAccessNativeIntArray *)0x0)) {
        JavascriptCopyOnAccessNativeIntArray::ConvertCopyOnAccessSegment(pJVar6);
      }
    }
    else {
      pJVar10 = (JavascriptArray *)0x0;
    }
  }
  if (jsReentLock._24_4_ == 0) goto LAB_00b8fea4;
  local_90 = pJVar10;
  if (pArr == (JavascriptArray *)0x0) {
LAB_00b8faf4:
    if (obj_00 == (TypedArrayBase *)0x0) {
LAB_00b8fb22:
      *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
      SliceObjectHelper(local_68,(uint32)local_70,0,pJVar10,(RecyclableObject *)obj_01,
                        jsReentLock._24_4_,local_78);
      goto LAB_00b8fea4;
    }
    bVar3 = VarIsCorrectType<Js::TypedArrayBase>(obj_00);
    if (!bVar3) {
      bVar3 = VarIsCorrectType<Js::TypedArrayBase>(obj_00);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x19bd,"(VarIsCorrectType(typedArrayBase))",
                                    "VarIsCorrectType(typedArrayBase)");
        if (!bVar3) goto LAB_00b90291;
        *puVar8 = 0;
      }
      Throw::FatalInternalError(-0x7fffbffb);
    }
    bVar3 = VarIs<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj_01);
    if (bVar3) {
      pTVar11 = UnsafeVarTo<Js::TypedArrayBase,Js::RecyclableObject>((RecyclableObject *)obj_01);
    }
    else {
      pTVar11 = (TypedArrayBase *)0x0;
    }
    if (pJVar10 == (JavascriptArray *)0x0 && pTVar11 == (TypedArrayBase *)0x0) {
      AssertCount = AssertCount + 1;
      local_88 = obj_01;
      Throw::LogAssert();
      puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar8 = 1;
      bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                  ,0x19c4,"(newArr != nullptr)","newArr != nullptr");
      if (bVar3) {
        *puVar8 = 0;
        Throw::FatalInternalError(-0x7fffbffb);
      }
      goto LAB_00b90291;
    }
    uVar15 = 0;
    local_88 = obj_01;
    do {
      uVar14 = (int)local_70 + uVar15;
      if ((local_80 != (TypedArrayBase *)0x0) ||
         (iVar5 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                    super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x24])(obj_00,(ulong)uVar14), iVar5 == 1)) {
        iVar5 = (*(obj_00->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
                  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
                  _vptr_IRecyclerVisitedObject[0x72])(obj_00,(ulong)uVar14);
        if (pTVar11 == (TypedArrayBase *)0x0) {
          (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
            super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x29])
                    (local_90,(ulong)uVar15,CONCAT44(extraout_var,iVar5),0);
        }
        else {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          (*(pTVar11->super_ArrayBufferParent).super_ArrayObject.super_DynamicObject.
            super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x70])(pTVar11,(ulong)uVar15,CONCAT44(extraout_var,iVar5));
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
        }
      }
      uVar15 = uVar15 + 1;
      obj_01 = local_88;
    } while (jsReentLock._24_4_ != uVar15);
  }
  else {
    bVar3 = IsNonES5Array(local_68);
    if (!bVar3) {
      bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_68);
      if (!bVar3) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x195b,"(VarIs<ES5Array>(obj))",
                                    "The array should have been converted to an ES5Array");
        if (!bVar3) goto LAB_00b90291;
        *puVar8 = 0;
      }
      goto LAB_00b8faf4;
    }
    bVar3 = HasAnyES5ArrayInPrototypeChain(pArr,false);
    if (bVar3) goto LAB_00b8fb22;
    if ((pJVar10 == (JavascriptArray *)0x0) || (local_33 != true)) {
      uVar15 = 0;
      do {
        *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
        iVar5 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                  super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
                  [0x71])(pArr,(ulong)((int)local_70 + uVar15),auStack_a8);
        JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        *(bool *)((long)local_60 + 0x108) = true;
        if (iVar5 != 0) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(obj_01->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x29])(obj_01,(ulong)uVar15,auStack_a8,4);
          ThrowErrorOnFailure(iVar5,local_78,uVar15);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          bVar3 = IsNonES5Array(local_68);
          if (!bVar3) {
            bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_68);
            pJVar10 = local_90;
            if (!bVar3) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
              *puVar8 = 1;
              bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                          ,0x19b5,"(VarIs<ES5Array>(obj))",
                                          "The array should have been converted to an ES5Array");
              if (!bVar3) goto LAB_00b90291;
              *puVar8 = 0;
            }
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            SliceObjectHelper(local_68,(uint32)local_70,uVar15 + 1,pJVar10,
                              (RecyclableObject *)obj_01,jsReentLock._24_4_,local_78);
            goto LAB_00b8fea4;
          }
        }
        uVar15 = uVar15 + 1;
      } while (jsReentLock._24_4_ != uVar15);
    }
    else {
      bVar3 = IsDirectAccessArray(pJVar10);
      if (bVar3) {
        start = (uint32)local_70;
        uVar15 = jsReentLock._24_4_;
        uVar14 = start + uVar15;
        if ((((pArr->head).ptr)->length < uVar14) || (((pJVar10->head).ptr)->size < uVar15)) {
          if (local_32 == true) {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            local_88 = obj_01;
            dstArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pJVar10);
            srcArray = VarTo<Js::JavascriptNativeIntArray,Js::JavascriptArray>(pArr);
            CopyNativeIntArrayElements(dstArray,0,srcArray,(uint32)local_70,uVar14);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          else {
            *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
            if (local_31[0] == true) {
              local_88 = obj_01;
              dstArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pJVar10);
              srcArray_00 = VarTo<Js::JavascriptNativeFloatArray,Js::JavascriptArray>(pArr);
              CopyNativeFloatArrayElements(dstArray_00,0,srcArray_00,(uint32)local_70,uVar14);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            }
            else {
              local_88 = obj_01;
              CopyArrayElements(pJVar10,0,pArr,start,uVar14);
              JsReentLock::MutateArrayObject((JsReentLock *)local_60);
            }
          }
        }
        else if (local_32 == true) {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          local_88 = obj_01;
          SliceHelper<int>(pArr,pJVar10,start,uVar15);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
        }
        else {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          if (local_31[0] == true) {
            local_88 = obj_01;
            SliceHelper<double>(pArr,pJVar10,start,uVar15);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
          else {
            local_88 = obj_01;
            SliceHelper<void*>(pArr,pJVar10,start,uVar15);
            JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          }
        }
        *(bool *)((long)local_60 + 0x108) = true;
        obj_01 = local_88;
      }
      else {
        local_88 = obj_01;
        if (DAT_0159ef99 == '\0') {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar8 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                      ,0x198c,"((Js::Configuration::Global.flags.ForceES5Array))",
                                      "newArr can only be ES5Array when it is forced");
          if (!bVar3) goto LAB_00b90291;
          *puVar8 = 0;
        }
        uVar15 = 0;
        do {
          *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
          iVar5 = (*(pArr->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
                    super_FinalizableObject.super_IRecyclerVisitedObject.
                    _vptr_IRecyclerVisitedObject[0x71])
                            (pArr,(ulong)((int)local_70 + uVar15),auStack_a8);
          JsReentLock::MutateArrayObject((JsReentLock *)local_60);
          *(bool *)((long)local_60 + 0x108) = true;
          if (iVar5 != 0) {
            (*(local_90->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
              super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject
              [0x29])(local_90,(ulong)uVar15,auStack_a8,0);
            bVar3 = IsNonES5Array(local_68);
            if (!bVar3) {
              bVar3 = VarIs<Js::ES5Array,Js::RecyclableObject>(local_68);
              obj_01 = local_88;
              pJVar10 = local_90;
              if (!bVar3) {
                AssertCount = AssertCount + 1;
                Throw::LogAssert();
                puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
                *puVar8 = 1;
                bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                            ,0x199c,"(VarIs<ES5Array>(obj))",
                                            "The array should have been converted to an ES5Array");
                if (!bVar3) goto LAB_00b90291;
                *puVar8 = 0;
              }
              *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
              SliceObjectHelper(local_68,(uint32)local_70,uVar15 + 1,pJVar10,
                                (RecyclableObject *)obj_01,jsReentLock._24_4_,local_78);
              goto LAB_00b8fea4;
            }
          }
          uVar15 = uVar15 + 1;
          obj_01 = local_88;
        } while (jsReentLock._24_4_ != uVar15);
      }
    }
  }
  local_88 = obj_01;
  obj_01 = local_88;
  if (local_80 == (TypedArrayBase *)0x0) {
    *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
    if ((int)jsReentLock._24_4_ < 0) {
      jsReentLock._24_8_ = (BADTYPE)(jsReentLock._24_8_ & 0xffffffff);
      uVar12 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_);
      bVar3 = NumberUtilities::IsNan((double)jsReentLock._24_8_);
      if (((bVar3) &&
          (uVar13 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
          uVar13 != 0xfff8000000000000)) &&
         (uVar13 = NumberUtilities::ToSpecial((double)jsReentLock._24_8_),
         uVar13 != 0x7ff8000000000000)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar8 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar8 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.inl"
                                    ,0xa2,
                                    "(!IsNan(value) || ToSpecial(value) == k_NegativeNan || ToSpecial(value) == 0x7FF8000000000000ull)"
                                    ,"We should only produce a NaN with this value");
        if (!bVar3) {
LAB_00b90291:
          pcVar2 = (code *)invalidInstructionException();
          (*pcVar2)();
        }
        *puVar8 = 0;
      }
      pvVar7 = (Var)(uVar12 ^ 0xfffc000000000000);
    }
    else {
      pvVar7 = (Var)((ulong)(jsReentLock._24_4_ & 0x7fffffff) | 0x1000000000000);
    }
    JavascriptOperators::SetProperty
              (obj_01,(RecyclableObject *)obj_01,0xd1,pvVar7,local_78,
               PropertyOperation_ThrowIfNotExtensible);
    JsReentLock::MutateArrayObject((JsReentLock *)local_60);
    *(bool *)((long)local_60 + 0x108) = true;
  }
  bVar3 = IsNonES5Array(obj_01);
  if ((bVar3) &&
     (pJVar10 = UnsafeVarTo<Js::JavascriptArray>(obj_01), pJVar10 != (JavascriptArray *)0x0)) {
    (*(pJVar10->super_ArrayObject).super_DynamicObject.super_RecyclableObject.
      super_FinalizableObject.super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x74])
              (pJVar10);
  }
LAB_00b8fea4:
  *(undefined1 *)((long)local_60 + 0x108) = jsReentLock.m_arrayObject2._0_1_;
  return obj_01;
}

Assistant:

Var JavascriptArray::SliceHelper(JavascriptArray* pArr, Js::TypedArrayBase* typedArrayBase, RecyclableObject* obj, T length, Arguments& args, ScriptContext* scriptContext)
    {
        JS_REENTRANCY_LOCK(jsReentLock, scriptContext->GetThreadContext());
        SETOBJECT_FOR_MUTATION(jsReentLock, pArr);

        JavascriptArray* newArr = nullptr;
        RecyclableObject* newObj = nullptr;
        bool isIntArray = false;
        bool isFloatArray = false;
        bool isTypedArrayEntryPoint = typedArrayBase != nullptr;
        bool isBuiltinArrayCtor = true;
        T startT = 0;
        T newLenT = length;
        T endT = length;

#if ENABLE_COPYONACCESS_ARRAY
        JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(pArr);
#endif
        if (args.Info.Count > 1)
        {
            JS_REENTRANT(jsReentLock, startT = GetFromIndex(args[1], length, scriptContext));

            if (args.Info.Count > 2 && JavascriptOperators::GetTypeId(args[2]) != TypeIds_Undefined)
            {
                JS_REENTRANT(jsReentLock, endT = GetFromIndex(args[2], length, scriptContext));
            }

            newLenT = endT > startT ? endT - startT : 0;
        }

        // Side effects (such as defining a property in a ToPrimitive call) during evaluation of arguments start or end may convert the array to an ES5 array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (TypedArrayBase::IsDetachedTypedArray(obj))
        {
            JavascriptError::ThrowTypeError(scriptContext, JSERR_DetachedTypedArray, _u("Array.prototype.slice"));
        }

        // If we came from Array.prototype.slice and source object is not a JavascriptArray, source could be a TypedArray
        if (!isTypedArrayEntryPoint && pArr == nullptr && VarIs<TypedArrayBase>(obj))
        {
            typedArrayBase = UnsafeVarTo<TypedArrayBase>(obj);
        }

        // If the entry point is %TypedArray%.prototype.slice or the source object is an Array exotic object we should try to load the constructor property
        // and use it to construct the return object.
        if (isTypedArrayEntryPoint)
        {
            JavascriptFunction* defaultConstructor = TypedArrayBase::GetDefaultConstructor(args[0], scriptContext);
            JS_REENTRANT(jsReentLock,
                RecyclableObject* constructor = JavascriptOperators::SpeciesConstructor(typedArrayBase, defaultConstructor, scriptContext));
            isBuiltinArrayCtor = false;

            AssertAndFailFast(pArr == nullptr);
            AssertOrFailFast(JavascriptOperators::IsConstructor(constructor));

            bool isDefaultConstructor = constructor == defaultConstructor;
            JS_REENTRANT(jsReentLock,
                newObj = VarTo<RecyclableObject>(
                    JavascriptOperators::NewObjectCreationHelper_ReentrancySafe(constructor, isDefaultConstructor, scriptContext->GetThreadContext(), [=]()->Js::Var
                    {
                        Js::Var constructorArgs[] = { constructor, JavascriptNumber::ToVar(newLenT, scriptContext) };
                        Js::CallInfo constructorCallInfo(Js::CallFlags_New, _countof(constructorArgs));
                        return TypedArrayBase::TypedArrayCreate(constructor, &Js::Arguments(constructorCallInfo, constructorArgs), (uint32)newLenT, scriptContext);
                    }));
            );
        }

        else if (pArr != nullptr)
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(pArr, newLenT, scriptContext, &isIntArray, &isFloatArray, &isBuiltinArrayCtor));
        }

        // skip the typed array and "pure" array case, we still need to handle special arrays like es5array, remote array, and proxy of array.
        else
        {
            JS_REENTRANT_NO_MUTATE(jsReentLock, newObj = ArraySpeciesCreate(obj, newLenT, scriptContext, nullptr, nullptr, &isBuiltinArrayCtor));
        }

        // If we didn't create a new object above we will create a new array here.
        // This is the pre-ES6 behavior or the case of calling Array.prototype.slice with a constructor argument that is not a constructor function.
        if (newObj == nullptr)
        {
            if (pArr)
            {
                pArr->GetArrayTypeAndConvert(&isIntArray, &isFloatArray);
            }

            if (newLenT > JavascriptArray::MaxArrayLength)
            {
                JavascriptError::ThrowRangeError(scriptContext, JSERR_ArrayLengthConstructIncorrect);
            }

            newArr = CreateNewArrayHelper(static_cast<uint32>(newLenT), isIntArray, isFloatArray, pArr, scriptContext);
#if ENABLE_COPYONACCESS_ARRAY
            JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            newObj = newArr;
            SET_SECOND_OBJECT_FOR_MUTATION(jsReentLock, newArr);
        }
        else
        {
            // If the new object we created is an array, remember that as it will save us time setting properties in the object below
            newArr = JavascriptArray::TryVarToNonES5Array(newObj);
            if (newArr)
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(newArr);
#endif
            }
        }

        uint32 start  = (uint32) startT;
        uint32 newLen = (uint32) newLenT;

        // We at least have to have newObj as a valid object
        Assert(newObj);

        // Bail out early if the new object will have zero length.
        if (newLen == 0)
        {
            return newObj;
        }

        // The ArraySpeciesCreate call above could have converted the source array into an ES5Array. If this happens
        // we will process the array elements like an ES5Array.
        if (pArr && !JavascriptArray::IsNonES5Array(obj))
        {
            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
            pArr = nullptr;
        }

        if (pArr)
        {
            if (HasAnyES5ArrayInPrototypeChain(pArr))
            {
                JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));
            }

            // If we constructed a new Array object, we have some nice helpers here
            if (newArr && isBuiltinArrayCtor)
            {
                if (JavascriptArray::IsDirectAccessArray(newArr))
                {
                    if (((start + newLen) <= pArr->head->length) && newLen <= newArr->head->size) //Fast Path
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<int32>(pArr, newArr, start, newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<double>(pArr, newArr, start, newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, SliceHelper<Var>(pArr, newArr, start, newLen));
                        }
                    }
                    else
                    {
                        if (isIntArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeIntArrayElements(VarTo<JavascriptNativeIntArray>(newArr), 0, VarTo<JavascriptNativeIntArray>(pArr), start, start + newLen));
                        }
                        else if (isFloatArray)
                        {
                            JS_REENTRANT(jsReentLock, CopyNativeFloatArrayElements(VarTo<JavascriptNativeFloatArray>(newArr), 0, VarTo<JavascriptNativeFloatArray>(pArr), start, start + newLen));
                        }
                        else
                        {
                            JS_REENTRANT(jsReentLock, CopyArrayElements(newArr, 0u, pArr, start, start + newLen));
                        }
                    }
                }
                else
                {
                    AssertMsg(CONFIG_FLAG(ForceES5Array), "newArr can only be ES5Array when it is forced");
                    Var element;
                    for (uint32 i = 0; i < newLen; i++)
                    {
                        JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                        if (!gotItem)
                        {
                            continue;
                        }

                        newArr->SetItem(i, element, PropertyOperation_None);

                        // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                        // we will process the rest of the array elements like an ES5Array.
                        if (!JavascriptArray::IsNonES5Array(obj))
                        {
                            AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                        }
                    }
                }
            }
            else
            {
                // The constructed object isn't an array, we'll need to use normal object manipulation
                Var element;

                for (uint32 i = 0; i < newLen; i++)
                {
                    JS_REENTRANT(jsReentLock, BOOL gotItem = pArr->DirectGetItemAtFull(i + start, &element));
                    if (!gotItem)
                    {
                        continue;
                    }

                    JS_REENTRANT(jsReentLock, ThrowErrorOnFailure(JavascriptArray::SetArrayLikeObjects(newObj, i, element), scriptContext, i));

                    // Side-effects in the prototype lookup may have changed the source array into an ES5Array. If this happens
                    // we will process the rest of the array elements like an ES5Array.
                    if (!JavascriptArray::IsNonES5Array(obj))
                    {
                        AssertOrFailFastMsg(VarIs<ES5Array>(obj), "The array should have been converted to an ES5Array");
                        JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, i + 1, newArr, newObj, newLen, scriptContext));
                    }
                }
            }
        }
        else if (typedArrayBase)
        {
            AssertAndFailFast(VarIsCorrectType(typedArrayBase));

            // Source is a TypedArray, we must have created the return object via a call to constructor, but newObj may not be a TypedArray (or an array either)
            TypedArrayBase* newTypedArray = JavascriptOperators::TryFromVar<Js::TypedArrayBase>(newObj);

            if (!newTypedArray)
            {
                AssertAndFailFast(newArr != nullptr);
            }

            Var element;

            for (uint32 i = 0; i < newLen; i++)
            {
                // We only need to call HasItem in the case that we are called from Array.prototype.slice
                if (!isTypedArrayEntryPoint && !typedArrayBase->HasItem(i + start))
                {
                    continue;
                }

                element = typedArrayBase->DirectGetItem(i + start);

                // The object we got back from the constructor might not be a TypedArray. In fact, it could be any object.
                if (newTypedArray)
                {
                    JS_REENTRANT(jsReentLock, newTypedArray->DirectSetItem(i, element));
                }
                else
                {
                    newArr->SetItem(i, element, PropertyOperation_None);
                }
            }
        }
        else
        {
            JS_REENTRANT_UNLOCK(jsReentLock, return JavascriptArray::SliceObjectHelper(obj, start, 0u, newArr, newObj, newLen, scriptContext));;
        }

        if (!isTypedArrayEntryPoint)
        {
            JS_REENTRANT(jsReentLock, JavascriptOperators::SetProperty(newObj, newObj, Js::PropertyIds::length, JavascriptNumber::ToVar(newLen, scriptContext), scriptContext, PropertyOperation_ThrowIfNotExtensible));
        }

#ifdef VALIDATE_ARRAY
        JavascriptArray * jsArr = JavascriptArray::TryVarToNonES5Array(newObj);
        if (jsArr)
        {
            jsArr->ValidateArray();
        }
#endif

        return newObj;
    }